

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

void __thiscall
booster::aio::stream_socket::async_write(stream_socket *this,const_buffer *buffer,io_handler *h)

{
  bool bVar1;
  writer_all *this_00;
  writer_all *pwVar2;
  io_handler *handler;
  const_buffer *in_RDI;
  pointer r;
  size_t n;
  error_code e;
  size_t in_stack_ffffffffffffff88;
  error_code *in_stack_ffffffffffffff90;
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all> *this_01;
  writer_all *in_stack_ffffffffffffff98;
  basic_io_device *in_stack_ffffffffffffffa0;
  writer_all *in_stack_ffffffffffffffa8;
  stream_socket *in_stack_ffffffffffffffb8;
  writer_all *in_stack_ffffffffffffffc0;
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all> local_38;
  writer_all *this_02;
  error_code local_28 [2];
  
  bVar1 = basic_io_device::dont_block
                    ((basic_io_device *)in_stack_ffffffffffffffa8,
                     (io_handler *)in_stack_ffffffffffffffa0);
  if (bVar1) {
    std::error_code::error_code(in_stack_ffffffffffffff90);
    this_00 = (writer_all *)
              write_some(in_stack_ffffffffffffffb8,in_RDI,(error_code *)in_stack_ffffffffffffffa8);
    bVar1 = std::error_code::operator_cast_to_bool(local_28);
    this_02 = this_00;
    if (((!bVar1) &&
        (pwVar2 = (writer_all *)
                  buffer_impl<const_char_*>::bytes_count((buffer_impl<const_char_*> *)this_00),
        in_stack_ffffffffffffffa8 = this_00, this_00 != pwVar2)) ||
       ((this_00 = in_stack_ffffffffffffffa8,
        bVar1 = std::error_code::operator_cast_to_bool(local_28), bVar1 &&
        (bVar1 = basic_io_device::would_block(in_stack_ffffffffffffff90), bVar1)))) {
      handler = (io_handler *)operator_new(0x58);
      anon_unknown_15::writer_all::writer_all
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI,(size_t)this_00,handler)
      ;
      this_01 = &local_38;
      intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all>::intrusive_ptr
                ((intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all> *)handler,
                 in_stack_ffffffffffffff98,SUB81((ulong)this_01 >> 0x38,0));
      intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all>::operator->(this_01);
      anon_unknown_15::writer_all::run(this_02);
      intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all>::~intrusive_ptr(this_01);
    }
    else {
      basic_io_device::get_io_service(in_stack_ffffffffffffffa0);
      io_service::post((io_service *)in_stack_ffffffffffffffa0,
                       (io_handler *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                       in_stack_ffffffffffffff88);
    }
  }
  return;
}

Assistant:

void stream_socket::async_write(const_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;

	#ifdef BOOSTER_AIO_FORCE_POLL
	writer_all::pointer r(new writer_all(this,buffer,0,h));
	r->run();
	#else
	system::error_code e;
	size_t n = write_some(buffer,e);
	if((!e && n!=buffer.bytes_count()) || (e && would_block(e))) {
		writer_all::pointer r(new writer_all(this,buffer,n,h));
		r->run();
	}
	else {
		get_io_service().post(h,e,n);
	}
	#endif




}